

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ScopedMessage::ScopedMessage(ScopedMessage *this,MessageBuilder *builder)

{
  IResultCapture *pIVar1;
  string local_38;
  MessageBuilder *local_18;
  MessageBuilder *builder_local;
  ScopedMessage *this_local;
  
  local_18 = builder;
  builder_local = (MessageBuilder *)this;
  MessageInfo::MessageInfo(&this->m_info,&builder->m_info);
  this->m_moved = false;
  ReusableStringStream::str_abi_cxx11_(&local_38,(ReusableStringStream *)local_18);
  std::__cxx11::string::operator=((string *)&(this->m_info).message,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pIVar1 = getResultCapture();
  (*pIVar1->_vptr_IResultCapture[10])(pIVar1,this);
  return;
}

Assistant:

ScopedMessage::ScopedMessage( MessageBuilder const& builder )
    : m_info( builder.m_info ), m_moved()
    {
        m_info.message = builder.m_stream.str();
        getResultCapture().pushScopedMessage( m_info );
    }